

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.c
# Opt level: O3

Bool prvTidyResetOptionToDefault(TidyDocImpl *doc,TidyOptionId optId)

{
  TidyOptionValue dflt;
  TidyOptionValue local_10;
  
  if (optId - TidyAccessibilityCheckLevel < 0x67) {
    if (option_defs[optId].id != optId) {
      __assert_fail("optId == option->id",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/geoffmcl[P]tidy-fork/src/config.c"
                    ,0x215,"Bool prvTidyResetOptionToDefault(TidyDocImpl *, TidyOptionId)");
    }
    if (option_defs[optId].type == TidyString) {
      local_10 = (TidyOptionValue)option_defs[optId].pdflt;
    }
    else {
      local_10 = (TidyOptionValue)option_defs[optId].dflt;
    }
    CopyOptionValue(doc,option_defs + optId,(doc->config).value + optId,&local_10);
  }
  return (Bool)(optId - TidyAccessibilityCheckLevel < 0x67);
}

Assistant:

Bool TY_(ResetOptionToDefault)( TidyDocImpl* doc, TidyOptionId optId )
{
    Bool status = ( optId > 0 && optId < N_TIDY_OPTIONS );
    if ( status )
    {
        TidyOptionValue dflt;
        const TidyOptionImpl* option = option_defs + optId;
        TidyOptionValue* value = &doc->config.value[ optId ];
        assert( optId == option->id );
        GetOptionDefault( option, &dflt );
        CopyOptionValue( doc, option, value, &dflt );
    }
    return status;
}